

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_stat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_lstat)

{
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue val_06;
  JSValue val_07;
  JSValue val_08;
  JSValue val_09;
  JSValue val_10;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue this_obj_04;
  JSValue this_obj_05;
  JSValue this_obj_06;
  JSValue this_obj_07;
  JSValue this_obj_08;
  JSValue this_obj_09;
  JSValue this_obj_10;
  JSValue obj_00;
  int iVar1;
  int *piVar2;
  JSValueUnion in_RDI;
  int in_R9D;
  JSValue JVar3;
  JSValue obj;
  stat st;
  int res;
  int err;
  char *path;
  JSValue v_10;
  JSValue v_9;
  JSValue v_8;
  JSValue v_7;
  JSValue v_6;
  JSValue v_5;
  JSValue v_4;
  JSValue v_3;
  JSValue v_2;
  JSValue v_1;
  JSValue v;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  int64_t in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff988;
  JSContext *in_stack_fffffffffffff990;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_fffffffffffff998;
  JSValueUnion ctx_01;
  int64_t in_stack_fffffffffffff9a0;
  JSValueUnion JVar4;
  undefined4 in_stack_fffffffffffff9a8;
  int32_t iVar5;
  int in_stack_fffffffffffff9ac;
  JSValueUnion in_stack_fffffffffffff9b0;
  JSValueUnion in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  stat local_520;
  int local_490;
  int local_48c;
  char *local_488;
  int local_47c;
  JSValueUnion local_468;
  undefined1 local_450 [8];
  int64_t local_448;
  __mode_t local_43c;
  JSValueUnion local_438;
  __mode_t local_430;
  undefined8 local_428;
  JSValueUnion local_420;
  int64_t local_418;
  JSValueUnion local_410;
  undefined8 local_408;
  int64_t local_400;
  JSValueUnion local_3f0;
  int64_t local_3e8;
  int local_3dc;
  int local_3d0;
  undefined4 uStack_3cc;
  undefined8 local_3c8;
  JSValueUnion local_3c0;
  int64_t local_3b8;
  JSValueUnion local_3b0;
  undefined8 local_3a8;
  int64_t local_3a0;
  JSValueUnion local_390;
  int64_t local_388;
  int local_37c;
  int local_370;
  undefined4 uStack_36c;
  undefined8 local_368;
  JSValueUnion local_360;
  int64_t local_358;
  JSValueUnion local_350;
  undefined8 local_348;
  int64_t local_340;
  JSContext *local_338;
  JSValueUnion local_330;
  int64_t local_328;
  int local_31c;
  JSContext *local_318;
  int local_310;
  undefined4 uStack_30c;
  undefined8 local_308;
  JSValueUnion local_300;
  int64_t local_2f8;
  JSValueUnion local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  JSValueUnion local_2d8;
  JSValueUnion local_2d0;
  int64_t local_2c8;
  int local_2bc;
  JSValueUnion local_2b8;
  int local_2b0;
  undefined4 uStack_2ac;
  undefined8 local_2a8;
  JSValueUnion local_2a0;
  int64_t local_298;
  JSValueUnion local_290;
  undefined8 local_288;
  long local_280;
  JSValueUnion local_278;
  JSValueUnion local_270;
  int64_t local_268;
  int local_25c;
  JSValueUnion local_258;
  int local_250;
  undefined4 uStack_24c;
  undefined8 local_248;
  JSValueUnion local_240;
  int64_t local_238;
  JSValueUnion local_230;
  undefined8 local_228;
  __dev_t local_220;
  JSValueUnion local_218;
  JSValueUnion local_210;
  int64_t local_208;
  int local_1fc;
  JSValueUnion local_1f8;
  int local_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  JSValueUnion local_1e0;
  int64_t local_1d8;
  undefined8 local_1c8;
  ulong local_1c0;
  JSValueUnion local_1b8;
  JSValueUnion local_1b0;
  int64_t local_1a8;
  uint local_19c;
  JSValueUnion local_198;
  uint local_190;
  undefined4 uStack_18c;
  undefined8 local_188;
  JSValueUnion local_180;
  int64_t local_178;
  undefined8 local_168;
  ulong local_160;
  JSValueUnion local_158;
  JSValueUnion local_150;
  int64_t local_148;
  uint local_13c;
  JSValueUnion local_138;
  uint local_130;
  undefined4 uStack_12c;
  undefined8 local_128;
  JSValueUnion local_120;
  int64_t local_118;
  JSValueUnion local_110;
  undefined8 local_108;
  __nlink_t local_100;
  JSValueUnion local_f8;
  JSValueUnion local_f0;
  int64_t local_e8;
  int local_dc;
  JSValueUnion local_d8;
  int local_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  JSValueUnion local_c0;
  int64_t local_b8;
  JSValueUnion local_b0;
  undefined8 local_a8;
  __ino_t local_a0;
  JSValueUnion local_98;
  JSValueUnion local_90;
  int64_t local_88;
  int local_7c;
  JSValueUnion local_78;
  int local_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_50;
  undefined8 local_48;
  __dev_t local_40;
  JSValueUnion local_38;
  JSValueUnion local_30;
  int64_t local_28;
  int local_1c;
  JSValueUnion local_18;
  int local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  JVar3.u._4_4_ = in_stack_fffffffffffff97c;
  JVar3.u.int32 = in_stack_fffffffffffff978;
  JVar3.tag = in_stack_fffffffffffff980;
  local_47c = in_R9D;
  local_468 = in_RDI;
  local_488 = JS_ToCString((JSContext *)0x115c22,JVar3);
  if (local_488 == (char *)0x0) {
    local_450 = (undefined1  [8])(stack0xfffffffffffffbb4 << 0x20);
    local_448 = 6;
  }
  else {
    if (local_47c == 0) {
      local_490 = stat(local_488,&local_520);
    }
    else {
      local_490 = lstat(local_488,&local_520);
    }
    JS_FreeCString(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    if (local_490 < 0) {
      piVar2 = __errno_location();
      local_48c = *piVar2;
    }
    else {
      local_48c = 0;
      JVar3 = JS_NewObject((JSContext *)0x115d16);
      iVar1 = JS_IsException(JVar3);
      if (iVar1 != 0) {
        local_450 = (undefined1  [8])(stack0xfffffffffffffbb4 << 0x20);
        local_448 = 6;
        return _local_450;
      }
      local_38.float64 = local_468.float64;
      local_40 = local_520.st_dev;
      iVar1 = (int)local_520.st_dev;
      if (local_520.st_dev == (long)iVar1) {
        local_18.float64 = local_468.float64;
        local_8 = 0;
        local_50._4_4_ = uStack_c;
        local_50.int32 = iVar1;
        local_48 = 0;
        local_28 = 0;
        local_30 = local_50;
        local_1c = iVar1;
        local_10 = iVar1;
      }
      else {
        _local_60 = __JS_NewFloat64((JSContext *)local_468.ptr,(double)(long)local_520.st_dev);
        local_30 = local_60;
        local_28 = local_58;
      }
      this_obj.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj.u.int32 = in_stack_fffffffffffff9a8;
      this_obj.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val.tag = in_stack_fffffffffffff9a0;
      val.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj,in_stack_fffffffffffff988,val,
                 in_stack_fffffffffffff9c0);
      local_98.float64 = local_468.float64;
      local_a0 = local_520.st_ino;
      iVar1 = (int)local_520.st_ino;
      if (local_520.st_ino == (long)iVar1) {
        local_78.float64 = local_468.float64;
        local_68 = 0;
        local_b0._4_4_ = uStack_6c;
        local_b0.int32 = iVar1;
        local_a8 = 0;
        local_88 = 0;
        local_90 = local_b0;
        local_7c = iVar1;
        local_70 = iVar1;
      }
      else {
        _local_c0 = __JS_NewFloat64((JSContext *)local_468.ptr,(double)(long)local_520.st_ino);
        local_90 = local_c0;
        local_88 = local_b8;
      }
      this_obj_00.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_00.u.int32 = in_stack_fffffffffffff9a8;
      this_obj_00.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_00.tag = in_stack_fffffffffffff9a0;
      val_00.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj_00,in_stack_fffffffffffff988,val_00,
                 in_stack_fffffffffffff9c0);
      local_438.float64 = local_468.float64;
      local_43c = local_520.st_mode;
      local_430 = local_520.st_mode;
      local_428 = 0;
      this_obj_01.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_01.u.int32 = in_stack_fffffffffffff9a8;
      this_obj_01.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_01.tag = in_stack_fffffffffffff9a0;
      val_01.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj_01,in_stack_fffffffffffff988,val_01,
                 in_stack_fffffffffffff9c0);
      local_f8.float64 = local_468.float64;
      local_100 = local_520.st_nlink;
      iVar1 = (int)local_520.st_nlink;
      if (local_520.st_nlink == (long)iVar1) {
        local_d8.float64 = local_468.float64;
        local_c8 = 0;
        local_110._4_4_ = uStack_cc;
        local_110.int32 = iVar1;
        local_108 = 0;
        local_e8 = 0;
        local_f0 = local_110;
        local_dc = iVar1;
        local_d0 = iVar1;
      }
      else {
        _local_120 = __JS_NewFloat64((JSContext *)local_468.ptr,(double)(long)local_520.st_nlink);
        local_f0 = local_120;
        local_e8 = local_118;
      }
      this_obj_02.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_02.u.int32 = in_stack_fffffffffffff9a8;
      this_obj_02.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_02.tag = in_stack_fffffffffffff9a0;
      val_02.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj_02,in_stack_fffffffffffff988,val_02,
                 in_stack_fffffffffffff9c0);
      local_160 = (ulong)local_520.st_uid;
      local_158.float64 = local_468.float64;
      if (local_160 == (long)(int)local_520.st_uid) {
        local_138.float64 = local_468.float64;
        local_13c = local_520.st_uid;
        local_130 = local_520.st_uid;
        local_128 = 0;
        local_150._4_4_ = uStack_12c;
        local_150.int32 = local_520.st_uid;
        local_168 = 0;
        local_148 = 0;
      }
      else {
        _local_180 = __JS_NewFloat64((JSContext *)local_468.ptr,(double)local_160);
        local_150 = local_180;
        local_148 = local_178;
      }
      this_obj_03.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_03.u.int32 = in_stack_fffffffffffff9a8;
      this_obj_03.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_03.tag = in_stack_fffffffffffff9a0;
      val_03.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj_03,in_stack_fffffffffffff988,val_03,
                 in_stack_fffffffffffff9c0);
      local_1c0 = (ulong)local_520.st_gid;
      local_1b8.float64 = local_468.float64;
      if (local_1c0 == (long)(int)local_520.st_gid) {
        local_198.float64 = local_468.float64;
        local_19c = local_520.st_gid;
        local_190 = local_520.st_gid;
        local_188 = 0;
        local_1b0._4_4_ = uStack_18c;
        local_1b0.int32 = local_520.st_gid;
        local_1c8 = 0;
        local_1a8 = 0;
      }
      else {
        _local_1e0 = __JS_NewFloat64((JSContext *)local_468.ptr,(double)local_1c0);
        local_1b0 = local_1e0;
        local_1a8 = local_1d8;
      }
      this_obj_04.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_04.u.int32 = in_stack_fffffffffffff9a8;
      this_obj_04.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_04.tag = in_stack_fffffffffffff9a0;
      val_04.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj_04,in_stack_fffffffffffff988,val_04,
                 in_stack_fffffffffffff9c0);
      in_stack_fffffffffffff9c0 = local_468.int32;
      in_stack_fffffffffffff9c4 = local_468._4_4_;
      local_218.float64 = local_468.float64;
      local_220 = local_520.st_rdev;
      iVar1 = (int)local_520.st_rdev;
      if (local_520.st_rdev == (long)iVar1) {
        local_1f8.float64 = local_468.float64;
        local_1e8 = 0;
        local_230._4_4_ = uStack_1ec;
        local_230.int32 = iVar1;
        local_228 = 0;
        local_208 = 0;
        local_210 = local_230;
        local_1fc = iVar1;
        local_1f0 = iVar1;
      }
      else {
        _local_240 = __JS_NewFloat64((JSContext *)local_468.ptr,(double)(long)local_520.st_rdev);
        local_210 = local_240;
        local_208 = local_238;
      }
      this_obj_05.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_05.u.int32 = in_stack_fffffffffffff9a8;
      this_obj_05.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_05.tag = in_stack_fffffffffffff9a0;
      val_05.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj_05,in_stack_fffffffffffff988,val_05,
                 in_stack_fffffffffffff9c0);
      local_278.float64 = local_468.float64;
      local_280 = local_520.st_size;
      iVar1 = (int)local_520.st_size;
      in_stack_fffffffffffff9b8 = local_468;
      if (local_520.st_size == iVar1) {
        local_258.float64 = local_468.float64;
        local_248 = 0;
        local_290._4_4_ = uStack_24c;
        local_290.int32 = iVar1;
        local_288 = 0;
        local_268 = 0;
        local_270 = local_290;
        local_25c = iVar1;
        local_250 = iVar1;
      }
      else {
        _local_2a0 = __JS_NewFloat64((JSContext *)local_468.ptr,(double)local_520.st_size);
        local_270 = local_2a0;
        local_268 = local_298;
      }
      this_obj_06.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_06.u.int32 = in_stack_fffffffffffff9a8;
      this_obj_06.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_06.tag = in_stack_fffffffffffff9a0;
      val_06.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj_06,in_stack_fffffffffffff988,val_06,
                 in_stack_fffffffffffff9c0);
      local_2d8.float64 = local_468.float64;
      local_2e0 = local_520.st_blocks;
      iVar1 = (int)local_520.st_blocks;
      in_stack_fffffffffffff9b0 = local_468;
      if (local_520.st_blocks == iVar1) {
        local_2b8.float64 = local_468.float64;
        local_2a8 = 0;
        local_2f0._4_4_ = uStack_2ac;
        local_2f0.int32 = iVar1;
        local_2e8 = 0;
        local_2c8 = 0;
        local_2d0 = local_2f0;
        local_2bc = iVar1;
        local_2b0 = iVar1;
      }
      else {
        _local_300 = __JS_NewFloat64((JSContext *)local_468.ptr,(double)local_520.st_blocks);
        local_2d0 = local_300;
        local_2c8 = local_2f8;
      }
      this_obj_07.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_07.u.int32 = in_stack_fffffffffffff9a8;
      this_obj_07.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_07.tag = in_stack_fffffffffffff9a0;
      val_07.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj_07,in_stack_fffffffffffff988,val_07,
                 in_stack_fffffffffffff9c0);
      iVar5 = local_468.int32;
      in_stack_fffffffffffff9ac = local_468._4_4_;
      JVar4 = local_468;
      local_340 = timespec_to_ms((timespec *)&local_520.st_atim);
      local_338 = (JSContext *)CONCAT44(in_stack_fffffffffffff9ac,iVar5);
      iVar1 = (int)local_340;
      if (local_340 == iVar1) {
        local_308 = 0;
        local_350._4_4_ = uStack_30c;
        local_350.int32 = iVar1;
        local_348 = 0;
        local_328 = 0;
        local_330 = local_350;
        local_31c = iVar1;
        local_318 = local_338;
        local_310 = iVar1;
      }
      else {
        _local_360 = __JS_NewFloat64(local_338,(double)local_340);
        local_330 = local_360;
        local_328 = local_358;
      }
      this_obj_08.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_08.u.int32 = iVar5;
      this_obj_08.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_08.tag = (int64_t)JVar4.ptr;
      val_08.u.ptr = in_stack_fffffffffffff998.ptr;
      JS_DefinePropertyValueStr
                (in_stack_fffffffffffff990,this_obj_08,in_stack_fffffffffffff988,val_08,
                 in_stack_fffffffffffff9c0);
      ctx_00 = local_468;
      ctx_01 = local_468;
      local_3a0 = timespec_to_ms((timespec *)&local_520.st_mtim);
      iVar1 = (int)local_3a0;
      if (local_3a0 == iVar1) {
        local_368 = 0;
        local_3b0._4_4_ = uStack_36c;
        local_3b0.int32 = iVar1;
        local_3a8 = 0;
        local_388 = 0;
        local_390 = local_3b0;
        local_37c = iVar1;
        local_370 = iVar1;
      }
      else {
        _local_3c0 = __JS_NewFloat64((JSContext *)ctx_01.ptr,(double)local_3a0);
        local_390 = local_3c0;
        local_388 = local_3b8;
      }
      this_obj_09.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_09.u.int32 = iVar5;
      this_obj_09.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_09.tag = (int64_t)JVar4.ptr;
      val_09.u.ptr = ctx_01.ptr;
      JS_DefinePropertyValueStr
                ((JSContext *)ctx_00.ptr,this_obj_09,in_stack_fffffffffffff988,val_09,
                 in_stack_fffffffffffff9c0);
      local_400 = timespec_to_ms((timespec *)&local_520.st_ctim);
      iVar1 = (int)local_400;
      if (local_400 == iVar1) {
        local_3c8 = 0;
        local_410._4_4_ = uStack_3cc;
        local_410.int32 = iVar1;
        local_408 = 0;
        local_3e8 = 0;
        local_3f0 = local_410;
        local_3dc = iVar1;
        local_3d0 = iVar1;
      }
      else {
        _local_420 = __JS_NewFloat64((JSContext *)local_468.ptr,(double)local_400);
        local_3f0 = local_420;
        local_3e8 = local_418;
      }
      this_obj_10.u._4_4_ = in_stack_fffffffffffff9ac;
      this_obj_10.u.int32 = iVar5;
      this_obj_10.tag = (int64_t)in_stack_fffffffffffff9b0.ptr;
      val_10.tag = (int64_t)JVar4.ptr;
      val_10.u.ptr = ctx_01.ptr;
      JS_DefinePropertyValueStr
                ((JSContext *)ctx_00.ptr,this_obj_10,(char *)local_468.ptr,val_10,
                 in_stack_fffffffffffff9c0);
    }
    obj_00.tag._0_4_ = in_stack_fffffffffffff9c0;
    obj_00.u.float64 = in_stack_fffffffffffff9b8.float64;
    obj_00.tag._4_4_ = in_stack_fffffffffffff9c4;
    _local_450 = make_obj_error((JSContext *)in_stack_fffffffffffff9b0.ptr,obj_00,
                                in_stack_fffffffffffff9ac);
  }
  return _local_450;
}

Assistant:

static JSValue js_os_stat(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int is_lstat)
{
    const char *path;
    int err, res;
    struct stat st;
    JSValue obj;

    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
#if defined(_WIN32)
    res = stat(path, &st);
#else
    if (is_lstat)
        res = lstat(path, &st);
    else
        res = stat(path, &st);
#endif
    JS_FreeCString(ctx, path);
    if (res < 0) {
        err = errno;
        obj = JS_NULL;
    } else {
        err = 0;
        obj = JS_NewObject(ctx);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        JS_DefinePropertyValueStr(ctx, obj, "dev",
                                  JS_NewInt64(ctx, st.st_dev),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "ino",
                                  JS_NewInt64(ctx, st.st_ino),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "mode",
                                  JS_NewInt32(ctx, st.st_mode),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "nlink",
                                  JS_NewInt64(ctx, st.st_nlink),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "uid",
                                  JS_NewInt64(ctx, st.st_uid),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "gid",
                                  JS_NewInt64(ctx, st.st_gid),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "rdev",
                                  JS_NewInt64(ctx, st.st_rdev),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "size",
                                  JS_NewInt64(ctx, st.st_size),
                                  JS_PROP_C_W_E);
#if !defined(_WIN32)
        JS_DefinePropertyValueStr(ctx, obj, "blocks",
                                  JS_NewInt64(ctx, st.st_blocks),
                                  JS_PROP_C_W_E);
#endif
#if defined(_WIN32)
        JS_DefinePropertyValueStr(ctx, obj, "atime",
                                  JS_NewInt64(ctx, (int64_t)st.st_atime * 1000),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "mtime",
                                  JS_NewInt64(ctx, (int64_t)st.st_mtime * 1000),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "ctime",
                                  JS_NewInt64(ctx, (int64_t)st.st_ctime * 1000),
                                  JS_PROP_C_W_E);
#elif defined(__APPLE__)
        JS_DefinePropertyValueStr(ctx, obj, "atime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_atimespec)),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "mtime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_mtimespec)),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "ctime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_ctimespec)),
                                  JS_PROP_C_W_E);
#else
        JS_DefinePropertyValueStr(ctx, obj, "atime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_atim)),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "mtime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_mtim)),
                                  JS_PROP_C_W_E);
        JS_DefinePropertyValueStr(ctx, obj, "ctime",
                                  JS_NewInt64(ctx, timespec_to_ms(&st.st_ctim)),
                                  JS_PROP_C_W_E);
#endif
    }
    return make_obj_error(ctx, obj, err);
}